

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O1

size_t HUF_buildCTable_wksp
                 (HUF_CElt *tree,uint *count,U32 maxSymbolValue,U32 maxNbBits,void *workSpace,
                 size_t wkspSize)

{
  short *psVar1;
  int *piVar2;
  byte bVar3;
  byte bVar4;
  U16 UVar5;
  uint uVar6;
  size_t sVar7;
  char *pcVar8;
  byte *pbVar9;
  byte bVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ushort uVar16;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  int iVar21;
  int iVar22;
  long lVar23;
  long lVar24;
  uint uVar25;
  uint uVar26;
  short sVar27;
  ulong uVar28;
  long lVar29;
  nodeElt *huffNode0;
  int iVar30;
  ulong uVar31;
  ulong uVar32;
  U16 nbPerRank [13];
  U16 valPerRank [13];
  undefined8 local_c0;
  undefined8 local_b8;
  undefined2 uStack_b0;
  undefined6 uStack_ae;
  undefined2 local_a8;
  undefined6 uStack_a6;
  undefined2 uStack_a0;
  undefined6 uStack_9e;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  undefined8 local_60;
  U16 aUStack_58 [20];
  
  sVar7 = 0xffffffffffffffff;
  if (((((ulong)workSpace & 3) == 0) && (sVar7 = 0xffffffffffffffbe, 0x10ff < wkspSize)) &&
     (sVar7 = 0xffffffffffffffd2, maxSymbolValue < 0x100)) {
    uVar19 = (ulong)(maxSymbolValue + 1);
    uVar20 = 0;
    local_c0 = tree;
    memset(workSpace,0,0x1100);
    do {
      uVar17 = 0x1f;
      if (count[uVar20] + 1 != 0) {
        for (; count[uVar20] + 1 >> uVar17 == 0; uVar17 = uVar17 - 1) {
        }
      }
      piVar2 = (int *)((long)workSpace + (ulong)uVar17 * 8 + 0x1000);
      *piVar2 = *piVar2 + 1;
      uVar20 = uVar20 + 1;
    } while (uVar19 != uVar20);
    lVar13 = 0x21e;
    do {
      iVar11 = *(int *)((long)workSpace + lVar13 * 8) + *(int *)((long)workSpace + lVar13 * 8 + 8);
      *(int *)((long)workSpace + lVar13 * 8) = iVar11;
      *(int *)((long)workSpace + lVar13 * 8 + 4) = iVar11;
      uVar20 = lVar13 - 0x1ff;
      lVar13 = lVar13 + -1;
    } while (1 < uVar20);
    uVar20 = 0;
    do {
      uVar17 = count[uVar20];
      uVar25 = 0x1f;
      if (uVar17 + 1 != 0) {
        for (; uVar17 + 1 >> uVar25 == 0; uVar25 = uVar25 - 1) {
        }
      }
      uVar28 = (ulong)uVar25;
      uVar25 = *(uint *)((long)workSpace + uVar28 * 8 + 0x100c);
      *(uint *)((long)workSpace + uVar28 * 8 + 0x100c) = uVar25 + 1;
      if (*(uint *)((long)workSpace + uVar28 * 8 + 0x1008) < uVar25) {
        do {
          uVar26 = uVar25 - 1;
          uVar14 = (ulong)uVar26;
          if (uVar17 <= *(uint *)((long)workSpace + uVar14 * 8 + 8)) goto LAB_006b106c;
          *(undefined8 *)((long)workSpace + (ulong)uVar25 * 8 + 8) =
               *(undefined8 *)((long)workSpace + uVar14 * 8 + 8);
          uVar25 = uVar26;
        } while (*(uint *)((long)workSpace + uVar28 * 8 + 0x1008) < uVar26);
      }
      else {
LAB_006b106c:
        uVar14 = (ulong)uVar25;
      }
      *(uint *)((long)workSpace + uVar14 * 8 + 8) = uVar17;
      *(char *)((long)workSpace + uVar14 * 8 + 0xe) = (char)uVar20;
      uVar20 = uVar20 + 1;
    } while (uVar20 != uVar19);
    local_78 = (ulong)maxSymbolValue;
    lVar23 = (local_78 << 0x20) + 0x10000000000;
    lVar24 = (local_78 << 0x20) + 0x100000000;
    lVar13 = 0;
    do {
      iVar11 = *(int *)((long)workSpace + lVar13 * 8 + local_78 * 8 + 8);
      lVar13 = lVar13 + -1;
      lVar23 = lVar23 + -0x100000000;
      lVar24 = lVar24 + -0x100000000;
    } while (iVar11 == 0);
    uVar17 = 0xb;
    if (maxNbBits != 0) {
      uVar17 = maxNbBits;
    }
    *(int *)((long)workSpace + 0x808) =
         iVar11 + *(int *)((long)workSpace + lVar13 * 8 + local_78 * 8 + 8);
    *(undefined2 *)((long)workSpace + lVar13 * 8 + local_78 * 8 + 0xc) = 0x100;
    *(undefined2 *)((long)workSpace + lVar13 * 8 + local_78 * 8 + 0x14) = 0x100;
    uVar28 = local_78 + lVar13 + 1;
    uVar20 = local_78 + lVar13 + 0x100;
    local_68 = uVar19;
    local_70 = uVar28;
    if ((long)uVar28 < 2) {
      *(undefined4 *)workSpace = 0x80000000;
    }
    else {
      uVar31 = (ulong)(maxSymbolValue - 1) + lVar13;
      uVar14 = 0x101;
      if (0x101 < (int)uVar20) {
        uVar14 = uVar20 & 0xffffffff;
      }
      uVar32 = 0x100;
      do {
        *(undefined4 *)((long)workSpace + uVar32 * 8 + 0x10) = 0x40000000;
        uVar32 = uVar32 + 1;
      } while (uVar14 != uVar32);
      *(undefined4 *)workSpace = 0x80000000;
      if (1 < (long)uVar28) {
        uVar14 = 0x101;
        if (0x101 < (int)uVar20) {
          uVar14 = uVar20 & 0xffffffff;
        }
        local_60 = uVar14 - 0x100;
        iVar11 = 0x100;
        lVar29 = 0;
        do {
          iVar30 = (int)uVar31;
          uVar25 = *(uint *)((long)workSpace + (long)iVar30 * 8 + 8);
          uVar26 = *(uint *)((long)workSpace + (long)iVar11 * 8 + 8);
          iVar22 = (iVar11 + 1) - (uint)(uVar25 < uVar26);
          iVar21 = iVar11;
          if (uVar25 < uVar26) {
            iVar21 = iVar30;
          }
          uVar6 = (uint)(uVar25 < uVar26);
          iVar18 = iVar30 - uVar6;
          uVar25 = *(uint *)((long)workSpace + (long)iVar18 * 8 + 8);
          uVar26 = *(uint *)((long)workSpace + (long)iVar22 * 8 + 8);
          iVar11 = (iVar22 + 1) - (uint)(uVar25 < uVar26);
          uVar31 = (ulong)((iVar30 - uVar6) - (uint)(uVar25 < uVar26));
          if (uVar25 < uVar26) {
            iVar22 = iVar18;
          }
          *(int *)((long)workSpace + lVar29 * 8 + 0x810) =
               *(int *)((long)workSpace + (long)iVar22 * 8 + 8) +
               *(int *)((long)workSpace + (long)iVar21 * 8 + 8);
          sVar27 = (short)lVar29 + 0x101;
          *(short *)((long)workSpace + (long)iVar22 * 8 + 0xc) = sVar27;
          *(short *)((long)workSpace + (long)iVar21 * 8 + 0xc) = sVar27;
          lVar29 = lVar29 + 1;
        } while (uVar14 - 0x100 != lVar29);
      }
    }
    *(undefined1 *)((long)workSpace + (lVar23 >> 0x1d) + 0xf) = 0;
    if (1 < (long)uVar28) {
      pcVar8 = (char *)((long)workSpace + (ulong)(maxSymbolValue + (int)lVar13 + 0xff) * 8 + 0xf);
      do {
        *pcVar8 = *(char *)((long)workSpace + (ulong)*(ushort *)(pcVar8 + -3) * 8 + 0xf) + '\x01';
        uVar25 = (int)uVar20 - 1;
        uVar20 = (ulong)uVar25;
        pcVar8 = pcVar8 + -8;
      } while (0x100 < (int)uVar25);
    }
    uVar20 = local_78 + lVar13 + 2;
    if (-1 < (long)uVar28) {
      uVar14 = 0;
      do {
        *(char *)((long)workSpace + uVar14 * 8 + 0xf) =
             *(char *)((long)workSpace +
                      (ulong)*(ushort *)((long)workSpace + uVar14 * 8 + 0xc) * 8 + 0xf) + '\x01';
        uVar14 = uVar14 + 1;
      } while ((uVar20 & 0xffffffff) != uVar14);
    }
    bVar3 = *(byte *)((long)workSpace + (uVar28 & 0xffffffff) * 8 + 0xf);
    iVar11 = bVar3 - uVar17;
    uVar25 = (uint)bVar3;
    if (uVar17 <= bVar3 && iVar11 != 0) {
      bVar10 = (byte)iVar11;
      bVar4 = *(byte *)((long)workSpace + (lVar24 >> 0x1d) + 0xf);
      uVar25 = (uint)bVar4;
      iVar11 = 0;
      uVar14 = uVar28;
      if (uVar17 < bVar4) {
        uVar14 = lVar24 >> 0x20;
        iVar11 = 0;
        do {
          iVar11 = (-1 << (bVar3 - (char)uVar25 & 0x1f)) + iVar11 + (1 << (bVar10 & 0x1f));
          *(char *)((long)workSpace + uVar14 * 8 + 0xf) = (char)uVar17;
          uVar25 = (uint)*(byte *)((long)workSpace + uVar14 * 8 + 7);
          uVar14 = uVar14 - 1;
        } while (uVar17 < uVar25);
      }
      uVar14 = (long)(int)uVar14 + 1;
      do {
        lVar13 = uVar14 * 8;
        uVar14 = uVar14 - 1;
      } while (uVar17 == *(byte *)((long)workSpace + lVar13 + 7));
      uVar26 = iVar11 >> (bVar10 & 0x1f);
      local_88 = 0xf0f0f0f0f0f0f0f0;
      local_98 = 0xf0f0f0f0f0f0f0f0;
      uStack_90 = 0xf0f0f0f0f0f0f0f0;
      local_a8 = 0xf0f0;
      uStack_a6 = 0xf0f0f0f0f0f0;
      uStack_a0 = 0xf0f0;
      uStack_9e = 0xf0f0f0f0f0f0;
      local_b8 = 0xf0f0f0f0f0f0f0f0;
      uStack_b0 = 0xf0f0;
      uStack_ae = 0xf0f0f0f0f0f0;
      if (-1 < (long)uVar14) {
        pbVar9 = (byte *)((long)workSpace + (uVar14 & 0xffffffff) * 8 + 0xf);
        uVar31 = uVar14 & 0xffffffff;
        uVar25 = uVar17;
        do {
          iVar11 = (int)uVar31;
          if (*pbVar9 < uVar25) {
            uVar25 = (uint)*pbVar9;
            *(int *)((long)&local_b8 + (ulong)(uVar17 - uVar25) * 4) = iVar11;
          }
          pbVar9 = pbVar9 + -8;
          uVar31 = (ulong)(iVar11 - 1);
        } while (0 < iVar11);
      }
      for (; 0 < (int)uVar26; uVar26 = (-1 << ((byte)uVar12 & 0x1f)) + uVar26) {
        uVar25 = 0x1f;
        if (uVar26 != 0) {
          for (; uVar26 >> uVar25 == 0; uVar25 = uVar25 - 1) {
          }
        }
        uVar32 = (ulong)(0x20 - (uVar25 ^ 0x1f));
        uVar31 = uVar32;
        if ((uVar25 ^ 0x1f) != 0x1f) {
          do {
            uVar15 = uVar31 - 1;
            uVar31 = (ulong)*(uint *)((long)&local_b8 + uVar31 * 4);
            if ((uVar31 != 0xf0f0f0f0) &&
               ((uVar25 = *(uint *)((long)&local_b8 + (uVar15 & 0xffffffff) * 4),
                uVar25 == 0xf0f0f0f0 ||
                (*(uint *)((long)workSpace + uVar31 * 8 + 8) <=
                 (uint)(*(int *)((long)workSpace + (ulong)uVar25 * 8 + 8) * 2)))))
            goto LAB_006b13de;
            uVar32 = (ulong)((int)uVar32 - 1);
            uVar31 = uVar15;
          } while ((uVar15 & 0xfffffffe) != 0);
          uVar32 = 1;
        }
LAB_006b13de:
        if ((uint)uVar32 < 0xd) {
          do {
            if (*(int *)((long)&local_b8 + uVar32 * 4) != -0xf0f0f10) goto LAB_006b1401;
            uVar32 = uVar32 + 1;
          } while (uVar32 != 0xd);
          uVar32 = 0xd;
        }
LAB_006b1401:
        uVar12 = (int)uVar32 - 1;
        uVar31 = uVar32 & 0xffffffff;
        uVar25 = *(uint *)((long)&local_b8 + uVar31 * 4);
        pcVar8 = (char *)((long)workSpace + (ulong)uVar25 * 8 + 0xf);
        *pcVar8 = *pcVar8 + '\x01';
        uVar6 = *(uint *)((long)&local_b8 + (ulong)uVar12 * 4);
        if (uVar6 == 0xf0f0f0f0) {
          uVar6 = uVar25;
        }
        *(uint *)((long)&local_b8 + (ulong)uVar12 * 4) = uVar6;
        if ((ulong)uVar25 == 0) {
          uVar25 = 0xf0f0f0f0;
        }
        else {
          uVar25 = uVar25 - 1;
          *(uint *)((long)&local_b8 + uVar31 * 4) = uVar25;
          if (uVar17 - (int)uVar32 != (uint)*(byte *)((long)workSpace + (ulong)uVar25 * 8 + 0xf)) {
            uVar25 = 0xf0f0f0f0;
          }
        }
        *(uint *)((long)&local_b8 + uVar31 * 4) = uVar25;
      }
      uVar25 = uVar17;
      if ((int)uVar26 < 0) {
        do {
          uVar6 = 0xffffffff;
          if (-1 < (int)uVar26) {
            uVar6 = uVar26;
          }
          iVar11 = 0;
          while (local_b8._4_4_ + iVar11 != -0xf0f0f10) {
            pcVar8 = (char *)((long)workSpace + (ulong)(iVar11 + local_b8._4_4_ + 1) * 8 + 0xf);
            *pcVar8 = *pcVar8 + -1;
            iVar11 = iVar11 + 1;
            if (~uVar6 + uVar26 + iVar11 == 0) goto LAB_006b14ef;
          }
          local_b8._4_4_ = (int)uVar14;
          iVar22 = uVar26 + iVar11;
          uVar14 = (long)local_b8._4_4_ + 1;
          local_b8._4_4_ = local_b8._4_4_ + 2;
          do {
            lVar13 = uVar14 * 8;
            uVar14 = uVar14 - 1;
            local_b8._4_4_ = local_b8._4_4_ + -1;
          } while (uVar17 == *(byte *)((long)workSpace + lVar13 + 7));
          pcVar8 = (char *)((long)workSpace + (long)local_b8._4_4_ * 8 + 0xf);
          *pcVar8 = *pcVar8 + -1;
          uVar26 = uVar26 + iVar11 + 1;
        } while (iVar22 < -1);
      }
    }
LAB_006b14ef:
    sVar7 = 0xffffffffffffffff;
    if (uVar25 < 0xd) {
      local_a8 = 0;
      uStack_a6 = 0;
      uStack_a0 = 0;
      local_b8 = 0;
      uStack_b0 = 0;
      uStack_ae = 0;
      aUStack_58[8] = 0;
      aUStack_58[9] = 0;
      aUStack_58[10] = 0;
      aUStack_58[0xb] = 0;
      aUStack_58[0xc] = 0;
      aUStack_58[0] = 0;
      aUStack_58[1] = 0;
      aUStack_58[2] = 0;
      aUStack_58[3] = 0;
      aUStack_58[4] = 0;
      aUStack_58[5] = 0;
      aUStack_58[6] = 0;
      aUStack_58[7] = 0;
      if (-1 < (long)uVar28) {
        uVar28 = 0;
        do {
          psVar1 = (short *)((long)&local_b8 +
                            (ulong)*(byte *)((long)workSpace + uVar28 * 8 + 0xf) * 2);
          *psVar1 = *psVar1 + 1;
          uVar28 = uVar28 + 1;
        } while ((uVar20 & 0xffffffff) != uVar28);
      }
      sVar7 = (size_t)uVar25;
      if (uVar25 != 0) {
        lVar13 = sVar7 + 1;
        uVar16 = 0;
        do {
          *(ushort *)((long)&local_60 + lVar13 * 2 + 6) = uVar16;
          uVar16 = (ushort)(uVar16 + *(short *)((long)&local_c0 + lVar13 * 2 + 6)) >> 1;
          lVar13 = lVar13 + -1;
        } while (1 < lVar13);
      }
      uVar20 = 0;
      do {
        local_c0[*(byte *)((long)workSpace + uVar20 * 8 + 0xe)].nbBits =
             *(BYTE *)((long)workSpace + uVar20 * 8 + 0xf);
        uVar20 = uVar20 + 1;
      } while (uVar19 != uVar20);
      uVar20 = 0;
      do {
        UVar5 = aUStack_58[local_c0[uVar20].nbBits];
        aUStack_58[local_c0[uVar20].nbBits] = UVar5 + 1;
        local_c0[uVar20].val = UVar5;
        uVar20 = uVar20 + 1;
      } while (uVar19 != uVar20);
    }
  }
  return sVar7;
}

Assistant:

size_t HUF_buildCTable_wksp (HUF_CElt* tree, const unsigned* count, U32 maxSymbolValue, U32 maxNbBits, void* workSpace, size_t wkspSize)
{
    HUF_buildCTable_wksp_tables* const wksp_tables = (HUF_buildCTable_wksp_tables*)workSpace;
    nodeElt* const huffNode0 = wksp_tables->huffNodeTbl;
    nodeElt* const huffNode = huffNode0+1;
    int nonNullRank;

    /* safety checks */
    if (((size_t)workSpace & 3) != 0) return ERROR(GENERIC);  /* must be aligned on 4-bytes boundaries */
    if (wkspSize < sizeof(HUF_buildCTable_wksp_tables))
      return ERROR(workSpace_tooSmall);
    if (maxNbBits == 0) maxNbBits = HUF_TABLELOG_DEFAULT;
    if (maxSymbolValue > HUF_SYMBOLVALUE_MAX)
      return ERROR(maxSymbolValue_tooLarge);
    ZSTD_memset(huffNode0, 0, sizeof(huffNodeTable));

    /* sort, decreasing order */
    HUF_sort(huffNode, count, maxSymbolValue, wksp_tables->rankPosition);

    /* build tree */
    nonNullRank = HUF_buildTree(huffNode, maxSymbolValue);

    /* enforce maxTableLog */
    maxNbBits = HUF_setMaxHeight(huffNode, (U32)nonNullRank, maxNbBits);
    if (maxNbBits > HUF_TABLELOG_MAX) return ERROR(GENERIC);   /* check fit into table */

    HUF_buildCTableFromTree(tree, huffNode, nonNullRank, maxSymbolValue, maxNbBits);

    return maxNbBits;
}